

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackLog *pcVar1;
  pointer pRVar2;
  bool bVar3;
  char *pcVar4;
  size_type sVar5;
  ostream *poVar6;
  reference pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  pointer this_01;
  cmSystemTools *pcVar8;
  char *pcVar9;
  pointer ppVar10;
  ulong uVar11;
  pointer ppVar12;
  char *remote;
  bool collapse;
  string local_19e0 [32];
  undefined1 local_19c0 [8];
  ostringstream cmCPackLog_msg_12;
  string local_1848 [32];
  undefined1 local_1828 [8];
  ostringstream cmCPackLog_msg_11;
  string local_16b0 [32];
  undefined1 local_1690 [8];
  ostringstream cmCPackLog_msg_10;
  undefined1 local_1518 [8];
  string destDir;
  undefined1 local_14d8 [8];
  ostringstream cmCPackLog_msg_9;
  _Self local_1360;
  _List_node_base *local_1358;
  string local_1350 [32];
  undefined1 local_1330 [8];
  ostringstream cmCPackLog_msg_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  undefined1 local_1198 [8];
  string goToDir;
  string curDir;
  iterator symlinkedIt;
  undefined1 local_1130 [8];
  ostringstream cmCPackLog_msg_7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fb8;
  undefined1 local_f78 [8];
  string inFileRelative;
  string targetFile;
  undefined1 local_f18 [8];
  ostringstream cmCPackLog_msg_6;
  string local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  string local_d20 [8];
  string filePath;
  undefined1 local_ce0 [8];
  ostringstream cmCPackLog_msg_5;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_b68;
  RegularExpression *local_b60;
  undefined1 local_b58 [8];
  string inFile;
  iterator iStack_b30;
  bool skip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b28;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_b20;
  iterator regIt;
  iterator gfit;
  undefined1 local_af0 [8];
  ostringstream cmCPackLog_msg_4;
  string local_978 [32];
  undefined1 local_958 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_7e0 [8];
  string findExpr;
  string subdir;
  string local_798 [8];
  string top;
  Glob gl;
  undefined1 local_700 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_588 [8];
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  string *tempDir;
  iterator it_1;
  string local_548 [32];
  undefined1 local_528 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_3a9;
  string local_3a8;
  undefined1 local_388 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  string local_368;
  char *local_348;
  char *installDirectories;
  string local_270 [32];
  undefined1 local_250 [8];
  ostringstream cmCPackLog_msg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  iterator it;
  string local_b8;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  allocator local_69;
  string local_68;
  char *local_48;
  char *cpackIgnoreFiles;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string *tempInstallDirectory_local;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  ignoreFilesRegex.
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tempInstallDirectory;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             &cpackIgnoreFiles);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CPACK_IGNORE_FILES",&local_69);
  pcVar4 = GetOption(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98);
    pcVar4 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,pcVar4,(allocator *)((long)&it._M_current + 7))
    ;
    cmSystemTools::ExpandListArgument
              (&local_b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_c8);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_98);
    local_c8._M_current = local_d0;
    while( true ) {
      local_d8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98);
      bVar3 = __gnu_cxx::operator!=(&local_c8,&local_d8);
      if (!bVar3) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      poVar6 = std::operator<<((ostream *)local_250,"Create ignore files regex for: ");
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      poVar6 = std::operator<<(poVar6,(string *)pbVar7);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14d,pcVar4);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_c8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&installDirectories,pcVar4);
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                 &cpackIgnoreFiles,(value_type *)&installDirectories);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&installDirectories);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_368,"CPACK_INSTALLED_DIRECTORIES",
             (allocator *)
             ((long)&installDirectoriesVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar4 = GetOption(this,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&installDirectoriesVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_348 = pcVar4;
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_388);
    pcVar4 = local_348;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,pcVar4,&local_3a9);
    cmSystemTools::ExpandListArgument
              (&local_3a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_388,false);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_388);
    if ((sVar5 & 1) == 0) {
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&tempDir);
      pRVar2 = ignoreFilesRegex.
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      tempDir = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_388);
      while( true ) {
        symlinkedFiles.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node._M_size =
             (size_t)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_388);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&tempDir,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&symlinkedFiles.
                               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl._M_node._M_size);
        if (!bVar3) break;
        std::__cxx11::
        list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_588);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_700);
        poVar6 = std::operator<<((ostream *)local_700,"Find files");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x167,pcVar4);
        std::__cxx11::string::~string((string *)&gl.ListDirs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_700);
        cmsys::Glob::Glob((Glob *)((long)&top.field_2 + 8));
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&tempDir);
        std::__cxx11::string::string(local_798,(string *)pbVar7);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&tempDir,0);
        pbVar7 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&tempDir);
        std::__cxx11::string::string((string *)(findExpr.field_2._M_local_buf + 8),(string *)pbVar7)
        ;
        std::__cxx11::string::string((string *)local_7e0,local_798);
        std::__cxx11::string::operator+=((string *)local_7e0,"/*");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_958);
        poVar6 = std::operator<<((ostream *)local_958,"- Install directory: ");
        poVar6 = std::operator<<(poVar6,local_798);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        remote = (char *)0x16f;
        cmCPackLog::Log(pcVar1,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x16f,pcVar4);
        std::__cxx11::string::~string(local_978);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_958);
        cmsys::Glob::RecurseOn((Glob *)((long)&top.field_2 + 8));
        cmsys::Glob::SetRecurseListDirs((Glob *)((long)&top.field_2 + 8),true);
        bVar3 = cmsys::Glob::FindFiles
                          ((Glob *)((long)&top.field_2 + 8),(string *)local_7e0,(GlobMessages *)0x0)
        ;
        if (bVar3) {
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&top.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->files,__x);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::__normal_iterator((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&regIt);
          __gnu_cxx::
          __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
          ::__normal_iterator(&local_b20);
          local_b28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin(&this->files);
          regIt._M_current = (RegularExpression *)local_b28;
          while( true ) {
            iStack_b30 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(&this->files);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&regIt,&stack0xfffffffffffff4d0);
            if (!bVar3) break;
            inFile.field_2._M_local_buf[0xf] = '\0';
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&regIt);
            std::__cxx11::string::string((string *)local_b58,(string *)pbVar7);
            pbVar7 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&regIt);
            bVar3 = cmsys::SystemTools::FileIsDirectory(pbVar7);
            if (bVar3) {
              std::__cxx11::string::operator+=((string *)local_b58,'/');
            }
            local_b60 = (RegularExpression *)
                        std::
                        vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        ::begin((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                 *)&cpackIgnoreFiles);
            local_b20._M_current = local_b60;
            while( true ) {
              local_b68._M_current =
                   (RegularExpression *)
                   std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ::end((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          *)&cpackIgnoreFiles);
              bVar3 = __gnu_cxx::operator!=(&local_b20,&local_b68);
              if (!bVar3) break;
              this_01 = __gnu_cxx::
                        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                        ::operator->(&local_b20);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              bVar3 = cmsys::RegularExpression::find(this_01,pcVar4);
              if (bVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ce0);
                poVar6 = std::operator<<((ostream *)local_ce0,"Ignore file: ");
                poVar6 = std::operator<<(poVar6,(string *)local_b58);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                remote = (char *)0x18a;
                cmCPackLog::Log(pcVar1,2,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x18a,pcVar4);
                std::__cxx11::string::~string((string *)(filePath.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ce0);
                inFile.field_2._M_local_buf[0xf] = '\x01';
              }
              __gnu_cxx::
              __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
              ::operator++(&local_b20);
            }
            if ((inFile.field_2._M_local_buf[0xf] & 1U) == 0) {
              std::__cxx11::string::string(local_d20,(string *)pRVar2);
              std::operator+(&local_d80,"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&findExpr.field_2 + 8));
              std::operator+(&local_d60,&local_d80,"/");
              pcVar8 = (cmSystemTools *)std::__cxx11::string::c_str();
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&regIt);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::RelativePath_abi_cxx11_(&local_da0,pcVar8,pcVar4,remote);
              std::operator+(&local_d40,&local_d60,&local_da0);
              std::__cxx11::string::operator+=(local_d20,(string *)&local_d40);
              std::__cxx11::string::~string((string *)&local_d40);
              std::__cxx11::string::~string((string *)&local_da0);
              std::__cxx11::string::~string((string *)&local_d60);
              std::__cxx11::string::~string((string *)&local_d80);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f18);
              poVar6 = std::operator<<((ostream *)local_f18,"Copy file: ");
              poVar6 = std::operator<<(poVar6,(string *)local_b58);
              poVar6 = std::operator<<(poVar6," -> ");
              poVar6 = std::operator<<(poVar6,local_d20);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar4 = (char *)std::__cxx11::string::c_str();
              remote = (char *)0x196;
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x196,pcVar4);
              std::__cxx11::string::~string((string *)(targetFile.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f18);
              bVar3 = cmsys::SystemTools::FileIsSymlink((string *)local_b58);
              if (bVar3) {
                std::__cxx11::string::string((string *)(inFileRelative.field_2._M_local_buf + 8));
                pcVar8 = (cmSystemTools *)std::__cxx11::string::c_str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::RelativePath_abi_cxx11_((string *)local_f78,pcVar8,pcVar4,remote);
                cmsys::SystemTools::ReadSymlink
                          ((string *)local_b58,(string *)((long)&inFileRelative.field_2 + 8));
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_fb8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&inFileRelative.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f78);
                std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_588,&local_fb8);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~pair(&local_fb8);
                std::__cxx11::string::~string((string *)local_f78);
                std::__cxx11::string::~string((string *)(inFileRelative.field_2._M_local_buf + 8));
LAB_0047fdbe:
                it_1._M_current._4_4_ = 0;
              }
              else {
                pcVar4 = (char *)std::__cxx11::string::c_str();
                pcVar9 = (char *)std::__cxx11::string::c_str();
                bVar3 = cmSystemTools::CopyFileIfDifferent(pcVar4,pcVar9);
                if (bVar3) {
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  bVar3 = cmSystemTools::CopyFileTime(pcVar4,pcVar9);
                  if (bVar3) goto LAB_0047fdbe;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1130);
                poVar6 = std::operator<<((ostream *)local_1130,"Problem copying file: ");
                poVar6 = std::operator<<(poVar6,(string *)local_b58);
                poVar6 = std::operator<<(poVar6," -> ");
                poVar6 = std::operator<<(poVar6,local_d20);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                remote = (char *)0x1a9;
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1a9,pcVar4);
                std::__cxx11::string::~string((string *)&symlinkedIt);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1130);
                this_local._4_4_ = 0;
                it_1._M_current._4_4_ = 1;
              }
              std::__cxx11::string::~string(local_d20);
            }
            else {
              it_1._M_current._4_4_ = 0x14;
            }
            std::__cxx11::string::~string((string *)local_b58);
            if ((it_1._M_current._4_4_ != 0) && (it_1._M_current._4_4_ != 0x14)) goto LAB_00480703;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&regIt);
          }
          bVar3 = std::__cxx11::
                  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_588);
          if (!bVar3) {
            std::
            _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_List_iterator((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&curDir.field_2 + 8));
            cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                      ((string *)((long)&goToDir.field_2 + 8),(SystemTools *)0x1,collapse);
            std::__cxx11::string::string((string *)local_1198,(string *)pRVar2);
            std::operator+(&local_11b8,"/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&findExpr.field_2 + 8));
            std::__cxx11::string::operator+=((string *)local_1198,(string *)&local_11b8);
            std::__cxx11::string::~string((string *)&local_11b8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1330);
            poVar6 = std::operator<<((ostream *)local_1330,"Change dir to: ");
            poVar6 = std::operator<<(poVar6,(string *)local_1198);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1b5,pcVar4);
            std::__cxx11::string::~string(local_1350);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1330);
            cmsys::SystemTools::ChangeDirectory((string *)local_1198);
            local_1358 = (_List_node_base *)
                         std::__cxx11::
                         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_588);
            curDir.field_2._8_8_ = local_1358;
            while( true ) {
              local_1360._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_588);
              bVar3 = std::operator!=((_Self *)((long)&curDir.field_2 + 8),&local_1360);
              if (!bVar3) break;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14d8);
              poVar6 = std::operator<<((ostream *)local_14d8,"Will create a symlink: ");
              ppVar10 = std::
                        _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&curDir.field_2 + 8));
              poVar6 = std::operator<<(poVar6,(string *)&ppVar10->second);
              poVar6 = std::operator<<(poVar6,"--> ");
              ppVar10 = std::
                        _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&curDir.field_2 + 8));
              poVar6 = std::operator<<(poVar6,(string *)ppVar10);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar4 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x1bd,pcVar4);
              std::__cxx11::string::~string((string *)(destDir.field_2._M_local_buf + 8));
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14d8);
              ppVar10 = std::
                        _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&curDir.field_2 + 8));
              cmsys::SystemTools::GetFilenamePath((string *)local_1518,&ppVar10->second);
              uVar11 = std::__cxx11::string::empty();
              if (((uVar11 & 1) == 0) &&
                 (bVar3 = cmsys::SystemTools::MakeDirectory((string *)local_1518), !bVar3)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1690);
                poVar6 = std::operator<<((ostream *)local_1690,"Cannot create dir: ");
                poVar6 = std::operator<<(poVar6,(string *)local_1518);
                poVar6 = std::operator<<(poVar6,"\nTrying to create symlink: ");
                ppVar10 = std::
                          _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&curDir.field_2 + 8));
                poVar6 = std::operator<<(poVar6,(string *)&ppVar10->second);
                poVar6 = std::operator<<(poVar6,"--> ");
                ppVar10 = std::
                          _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&curDir.field_2 + 8));
                poVar6 = std::operator<<(poVar6,(string *)ppVar10);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1c8,pcVar4);
                std::__cxx11::string::~string(local_16b0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1690);
              }
              this_00 = (_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&curDir.field_2 + 8);
              ppVar10 = std::
                        _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->(this_00);
              ppVar12 = std::
                        _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator->(this_00);
              bVar3 = cmsys::SystemTools::CreateSymlink(&ppVar10->first,&ppVar12->second);
              if (!bVar3) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1828);
                poVar6 = std::operator<<((ostream *)local_1828,"Cannot create symlink: ");
                ppVar10 = std::
                          _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&curDir.field_2 + 8));
                poVar6 = std::operator<<(poVar6,(string *)&ppVar10->second);
                poVar6 = std::operator<<(poVar6,"--> ");
                ppVar10 = std::
                          _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator->((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&curDir.field_2 + 8));
                poVar6 = std::operator<<(poVar6,(string *)ppVar10);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar4 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1cf,pcVar4);
                std::__cxx11::string::~string(local_1848);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1828);
                this_local._4_4_ = 0;
              }
              it_1._M_current._5_3_ = 0;
              it_1._M_current._4_1_ = !bVar3;
              std::__cxx11::string::~string((string *)local_1518);
              if (it_1._M_current._4_4_ != 0) goto LAB_00480687;
              std::
              _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator++((_List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&curDir.field_2 + 8));
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19c0);
            poVar6 = std::operator<<((ostream *)local_19c0,"Going back to: ");
            poVar6 = std::operator<<(poVar6,(string *)(goToDir.field_2._M_local_buf + 8));
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,4,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x1d4,pcVar4);
            std::__cxx11::string::~string(local_19e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19c0);
            cmsys::SystemTools::ChangeDirectory((string *)((long)&goToDir.field_2 + 8));
            it_1._M_current._4_4_ = 0;
LAB_00480687:
            std::__cxx11::string::~string((string *)local_1198);
            std::__cxx11::string::~string((string *)(goToDir.field_2._M_local_buf + 8));
            if (it_1._M_current._4_4_ != 0) goto LAB_00480703;
          }
          it_1._M_current._4_4_ = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af0);
          poVar6 = std::operator<<((ostream *)local_af0,
                                   "Cannot find any files in the installed directory");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x175,pcVar4);
          std::__cxx11::string::~string((string *)&gfit);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af0);
          this_local._4_4_ = 0;
          it_1._M_current._4_4_ = 1;
        }
LAB_00480703:
        std::__cxx11::string::~string((string *)local_7e0);
        std::__cxx11::string::~string((string *)(findExpr.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_798);
        cmsys::Glob::~Glob((Glob *)((long)&top.field_2 + 8));
        std::__cxx11::
        list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_588);
        if (it_1._M_current._4_4_ != 0) goto LAB_004807a6;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&tempDir);
      }
      it_1._M_current._4_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
      poVar6 = std::operator<<((ostream *)local_528,
                               "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                              );
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x15d,pcVar4);
      std::__cxx11::string::~string(local_548);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
      this_local._4_4_ = 0;
      it_1._M_current._4_4_ = 1;
    }
LAB_004807a6:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    if (it_1._M_current._4_4_ != 0) goto LAB_004807df;
  }
  this_local._4_4_ = 1;
  it_1._M_current._4_4_ = 1;
LAB_004807df:
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
             &cpackIgnoreFiles);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if ( cpackIgnoreFiles )
    {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    std::vector<std::string>::iterator it;
    for ( it = ignoreFilesRegexString.begin();
      it != ignoreFilesRegexString.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
        "Create ignore files regex for: " << *it << std::endl);
      ignoreFilesRegex.push_back(it->c_str());
      }
    }
  const char* installDirectories
    = this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if ( installDirectories && *installDirectories )
    {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
      installDirectoriesVector);
    if ( installDirectoriesVector.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation." << std::endl);
      return 0;
      }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for ( it = installDirectoriesVector.begin();
      it != installDirectoriesVector.end();
      ++it )
      {
      std::list<std::pair<std::string,std::string> > symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it ++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if ( !gl.FindFiles(findExpr) )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Cannot find any files in the installed directory" << std::endl);
        return 0;
        }
      files = gl.GetFiles();
      std::vector<std::string>::iterator gfit;
      std::vector<cmsys::RegularExpression>::iterator regIt;
      for ( gfit = files.begin(); gfit != files.end(); ++ gfit )
        {
        bool skip = false;
        std::string inFile = *gfit;
        if(cmSystemTools::FileIsDirectory(*gfit))
          {
          inFile += '/';
          }
        for ( regIt= ignoreFilesRegex.begin();
          regIt!= ignoreFilesRegex.end();
          ++ regIt)
          {
          if ( regIt->find(inFile.c_str()) )
            {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Ignore file: "
              << inFile << std::endl);
            skip = true;
            }
          }
        if ( skip )
          {
          continue;
          }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/"
          + cmSystemTools::RelativePath(top.c_str(), gfit->c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Copy file: "
          << inFile << " -> " << filePath << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if ( cmSystemTools::FileIsSymlink(inFile))
          {
          std::string targetFile;
          std::string inFileRelative =
             cmSystemTools::RelativePath(top.c_str(),inFile.c_str());
          cmSystemTools::ReadSymlink(inFile,targetFile);
          symlinkedFiles.push_back(std::pair<std::string,
                                   std::string>(targetFile,inFileRelative));
          }
        /* If it is not a symlink then do a plain copy */
        else if (!(
            cmSystemTools::CopyFileIfDifferent(inFile.c_str(),filePath.c_str())
            &&
            cmSystemTools::CopyFileTime(inFile.c_str(),filePath.c_str())
                ) )
          {
          cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem copying file: "
            << inFile << " -> " << filePath << std::endl);
          return 0;
          }
        }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty())
        {
        std::list< std::pair<std::string,std::string> >::iterator symlinkedIt;
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir  += "/"+subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir <<std::endl);
        cmSystemTools::ChangeDirectory(goToDir);
        for (symlinkedIt=symlinkedFiles.begin();
             symlinkedIt != symlinkedFiles.end();
             ++symlinkedIt)
          {
          cmCPackLogger(cmCPackLog::LOG_DEBUG, "Will create a symlink: "
                         << symlinkedIt->second << "--> "
                         << symlinkedIt->first << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinkedIt->second);
          if(!destDir.empty() && !cmSystemTools::MakeDirectory(destDir))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create dir: "
                          << destDir
                          << "\nTrying to create symlink: "
                          << symlinkedIt->second << "--> "
                          << symlinkedIt->first
                          << std::endl);
            }
          if (!cmSystemTools::CreateSymlink(symlinkedIt->first,
                                            symlinkedIt->second))
            {
            cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot create symlink: "
                            << symlinkedIt->second << "--> "
                            << symlinkedIt->first << std::endl);
            return 0;
            }
          }
        cmCPackLogger(cmCPackLog::LOG_DEBUG, "Going back to: "
                      << curDir <<std::endl);
        cmSystemTools::ChangeDirectory(curDir);
        }
      }
    }
  return 1;
}